

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cc
# Opt level: O0

void __thiscall dh::symTab::symTab(symTab *this,string *in_function)

{
  shared_ptr<dh::symTab> local_48 [2];
  shared_ptr<dh::symTabElem> local_28;
  string *local_18;
  string *in_function_local;
  symTab *this_local;
  
  local_18 = in_function;
  in_function_local = (string *)this;
  std::shared_ptr<dh::symTab>::shared_ptr(&this->upper_tab);
  std::vector<std::shared_ptr<dh::symTab>,_std::allocator<std::shared_ptr<dh::symTab>_>_>::vector
            (&this->donw_tabs);
  std::vector<std::shared_ptr<dh::symTabElem>,_std::allocator<std::shared_ptr<dh::symTabElem>_>_>::
  vector(&this->container);
  std::__cxx11::string::string((string *)&this->in_function);
  std::shared_ptr<dh::symTabElem>::shared_ptr(&local_28,(nullptr_t)0x0);
  std::vector<std::shared_ptr<dh::symTabElem>,_std::allocator<std::shared_ptr<dh::symTabElem>_>_>::
  resize(&this->container,0x100,&local_28);
  std::shared_ptr<dh::symTabElem>::~shared_ptr(&local_28);
  std::shared_ptr<dh::symTab>::shared_ptr(local_48,(nullptr_t)0x0);
  std::shared_ptr<dh::symTab>::operator=(&this->upper_tab,local_48);
  std::shared_ptr<dh::symTab>::~shared_ptr(local_48);
  std::__cxx11::string::operator=((string *)&this->in_function,(string *)in_function);
  this->totaloffset = 0;
  return;
}

Assistant:

symTab::symTab( ::std::string in_function)
{
	this->container.resize(256,nullptr);
	this->upper_tab = nullptr;
	this->in_function = in_function;
	this->totaloffset = 0;
}